

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codewriter.cpp
# Opt level: O0

bool asmjit::v1_14::CodeWriterUtils::writeOffset(void *dst,int64_t offset64,OffsetFormat *format)

{
  bool bVar1;
  uint64_t *dst_00;
  OffsetFormat *in_RDX;
  int64_t in_RSI;
  long in_RDI;
  uint64_t mask_3;
  uint32_t mask_2;
  uint32_t mask_1;
  uint32_t mask;
  ulong local_108;
  uint local_fc;
  ushort local_f8;
  byte local_f4;
  bool local_d1;
  OffsetFormat *in_stack_ffffffffffffff80;
  int64_t in_stack_ffffffffffffff88;
  uint32_t *in_stack_ffffffffffffff90;
  
  dst_00 = (uint64_t *)(in_RDI + (ulong)in_RDX->_valueOffset);
  switch(in_RDX->_valueSize) {
  case '\x01':
    bVar1 = encodeOffset32(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                           in_stack_ffffffffffffff80);
    if (bVar1) {
      *(byte *)dst_00 = (byte)*dst_00 | local_f4;
      local_d1 = true;
    }
    else {
      local_d1 = false;
    }
    break;
  case '\x02':
    bVar1 = encodeOffset32(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                           in_stack_ffffffffffffff80);
    if (bVar1) {
      *(ushort *)dst_00 = (ushort)*dst_00 | local_f8;
      local_d1 = true;
    }
    else {
      local_d1 = false;
    }
    break;
  default:
    local_d1 = false;
    break;
  case '\x04':
    bVar1 = encodeOffset32(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                           in_stack_ffffffffffffff80);
    if (bVar1) {
      *(uint *)dst_00 = (uint)*dst_00 | local_fc;
      local_d1 = true;
    }
    else {
      local_d1 = false;
    }
    break;
  case '\b':
    bVar1 = encodeOffset64(dst_00,in_RSI,in_RDX);
    if (bVar1) {
      *dst_00 = *dst_00 | local_108;
      local_d1 = true;
    }
    else {
      local_d1 = false;
    }
  }
  return local_d1;
}

Assistant:

bool CodeWriterUtils::writeOffset(void* dst, int64_t offset64, const OffsetFormat& format) noexcept {
  // Offset the destination by ValueOffset so the `dst` points to the
  // patched word instead of the beginning of the patched region.
  dst = static_cast<char*>(dst) + format.valueOffset();

  switch (format.valueSize()) {
    case 1: {
      uint32_t mask;
      if (!encodeOffset32(&mask, offset64, format))
        return false;

      Support::writeU8(dst, uint8_t(Support::readU8(dst) | mask));
      return true;
    }

    case 2: {
      uint32_t mask;
      if (!encodeOffset32(&mask, offset64, format))
        return false;

      Support::writeU16uLE(dst, uint16_t(Support::readU16uLE(dst) | mask));
      return true;
    }

    case 4: {
      uint32_t mask;
      if (!encodeOffset32(&mask, offset64, format)) {
        return false;
      }

      Support::writeU32uLE(dst, Support::readU32uLE(dst) | mask);
      return true;
    }

    case 8: {
      uint64_t mask;
      if (!encodeOffset64(&mask, offset64, format))
        return false;

      Support::writeU64uLE(dst, Support::readU64uLE(dst) | mask);
      return true;
    }

    default:
      return false;
  }
}